

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O2

void __thiscall rw::HAnimHierarchy::attachByIndex(HAnimHierarchy *this,int32 idx)

{
  HAnimNodeInfo *pHVar1;
  Frame *pFVar2;
  
  pHVar1 = this->nodeInfo;
  pFVar2 = findUnattachedById(this,this->parentFrame,pHVar1[idx].id);
  if (pFVar2 != (Frame *)0x0) {
    pHVar1[idx].frame = pFVar2;
  }
  return;
}

Assistant:

void
HAnimHierarchy::attachByIndex(int32 idx)
{
	int32 id = this->nodeInfo[idx].id;
//	Frame *f = findById(this->parentFrame, id);
	Frame *f = findUnattachedById(this, this->parentFrame, id);
	if(f)
		this->nodeInfo[idx].frame = f;
}